

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

int match_class(int c,int cl)

{
  uint uVar1;
  bool bVar2;
  
  if ((cl & 0xc0U) == 0x40) {
    if ((0xfe56ef65U >> (cl & 0x1fU) & 1) == 0) {
      uVar1 = (uint)((""[(ulong)(uint)c + 1] & ""[cl & 0x1fU]) == 0);
      if ((cl & 0x20U) != 0) {
        uVar1 = (uint)(""[(ulong)(uint)c + 1] & ""[cl & 0x1fU]);
      }
      return uVar1;
    }
    if (cl == 0x5a) {
      return (int)(c != 0);
    }
    if (cl == 0x7a) {
      bVar2 = c == 0;
      goto LAB_0015221b;
    }
  }
  bVar2 = cl == c;
LAB_0015221b:
  return (int)bVar2;
}

Assistant:

static int match_class(int c, int cl)
{
  if ((cl & 0xc0) == 0x40) {
    int t = match_class_map[(cl&0x1f)];
    if (t) {
      t = lj_char_isa(c, t);
      return (cl & 0x20) ? t : !t;
    }
    if (cl == 'z') return c == 0;
    if (cl == 'Z') return c != 0;
  }
  return (cl == c);
}